

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O0

int Csw_CutSupportMinimize(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  uint uWord;
  int nVars;
  uint *pTruth_00;
  int local_38;
  int local_34;
  int k;
  int i;
  int nFansNew;
  int uSupp;
  uint *pTruth;
  Csw_Cut_t *pCut_local;
  Csw_Man_t *p_local;
  
  pTruth_00 = Csw_CutTruth(pCut);
  uWord = Kit_TruthSupport(pTruth_00,p->nLeafMax);
  nVars = Kit_WordCountOnes(uWord);
  if (nVars != pCut->nFanins) {
    if (pCut->nFanins <= nVars) {
      __assert_fail("nFansNew < pCut->nFanins",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                    ,0xc1,"int Csw_CutSupportMinimize(Csw_Man_t *, Csw_Cut_t *)");
    }
    Kit_TruthShrink(p->puTemp[0],pTruth_00,nVars,p->nLeafMax,uWord,1);
    local_38 = 0;
    for (local_34 = 0; local_34 < pCut->nFanins; local_34 = local_34 + 1) {
      if ((uWord & 1 << ((byte)local_34 & 0x1f)) != 0) {
        *(undefined4 *)((long)&pCut[1].pNext + (long)local_38 * 4) =
             *(undefined4 *)((long)&pCut[1].pNext + (long)local_34 * 4);
        local_38 = local_38 + 1;
      }
    }
    if (local_38 != nVars) {
      __assert_fail("k == nFansNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/csw/cswCut.c"
                    ,199,"int Csw_CutSupportMinimize(Csw_Man_t *, Csw_Cut_t *)");
    }
    pCut->nFanins = (char)nVars;
  }
  return nVars;
}

Assistant:

int Csw_CutSupportMinimize( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    unsigned * pTruth;
    int uSupp, nFansNew, i, k;
    // get truth table
    pTruth = Csw_CutTruth( pCut );
    // get support 
    uSupp = Kit_TruthSupport( pTruth, p->nLeafMax );
    // get the new support size
    nFansNew = Kit_WordCountOnes( uSupp );
    // check if there are redundant variables
    if ( nFansNew == pCut->nFanins )
        return nFansNew;
    assert( nFansNew < pCut->nFanins );
    // minimize support
    Kit_TruthShrink( p->puTemp[0], pTruth, nFansNew, p->nLeafMax, uSupp, 1 );
    for ( i = k = 0; i < pCut->nFanins; i++ )
        if ( uSupp & (1 << i) )
            pCut->pFanins[k++] = pCut->pFanins[i];
    assert( k == nFansNew );
    pCut->nFanins = nFansNew;
//    assert( nFansNew == Kit_TruthSupportSize( pTruth, p->nLeafMax ) );
//Extra_PrintBinary( stdout, pTruth, (1<<p->nLeafMax) ); printf( "\n" );
    return nFansNew;
}